

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::EntrySymbolIterator(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *string;
  JavascriptLibrary *this_00;
  JavascriptStringIterator *pJVar7;
  JavascriptString *str;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb03,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb06,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec3f,L"String.prototype[Symbol.iterator]");
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xb0c,"(args.Info.Count > 0)","Negative argument count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar3 = JavascriptConversion::CheckObjectCoercible(pvVar6,pSVar4);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec42,L"String.prototype[Symbol.iterator]");
  }
  pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
  string = JavascriptConversion::ToString(pvVar6,pSVar4);
  this_00 = ScriptContext::GetLibrary(pSVar4);
  pJVar7 = JavascriptLibrary::CreateStringIterator(this_00,string);
  return pJVar7;
}

Assistant:

Var JavascriptString::EntrySymbolIterator(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedString, _u("String.prototype[Symbol.iterator]"));
        }
        AssertMsg(args.Info.Count > 0, "Negative argument count");

        if (!JavascriptConversion::CheckObjectCoercible(args[0], scriptContext))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("String.prototype[Symbol.iterator]"));
        }

        JavascriptString* str = JavascriptConversion::ToString(args[0], scriptContext);

        return scriptContext->GetLibrary()->CreateStringIterator(str);
    }